

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ExpressionTemplateTest::arithmeticOperatorsTest(ExpressionTemplateTest *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  int iVar7;
  value_type vVar8;
  value_type vVar9;
  value_type vVar10;
  value_type vVar11;
  value_type vVar12;
  value_type vVar13;
  value_type vVar14;
  value_type vVar15;
  value_type vVar16;
  value_type vVar17;
  value_type vVar18;
  value_type vVar19;
  undefined8 extraout_RAX;
  int *piVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  logic_error *plVar24;
  code *pcVar25;
  size_t sVar26;
  undefined *puVar27;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  size_t local_178;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_168;
  size_t local_150;
  undefined1 local_148 [16];
  size_t *local_138;
  size_t local_120;
  uint local_108;
  uint local_104;
  undefined1 local_100 [16];
  size_t *local_f0;
  size_t local_d8;
  value_type local_bc;
  View<int,_false,_std::allocator<unsigned_long>_> *local_b8;
  undefined4 local_b0;
  unsigned_long local_a8 [3];
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_90;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_78;
  BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  local_60;
  BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_48;
  
  local_a8[0] = 2;
  local_a8[1] = 3;
  local_a8[2] = 2;
  local_100._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_100 + 8),local_a8,
             (unsigned_long *)&local_90,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_148);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  local_148._0_8_ = this->dataInt_ + 2;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_148 + 8),local_a8,
             (unsigned_long *)&local_90,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_168);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148);
  sVar23 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  local_108 = (uint)sVar23;
  sVar26 = 0;
  do {
    local_178 = 0;
    local_150 = sVar26;
    do {
      local_104 = (uint)CONCAT71((int7)(sVar23 >> 8),1);
      sVar26 = 0;
      do {
        sVar23 = local_150;
        piVar20 = andres::
                  ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>::
                  operator()((ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                              *)local_100,sVar26,local_178,local_150);
        iVar7 = *piVar20;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ea81:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (iVar7 != ((int *)uVar6)[sVar21 * sVar26 + sVar22]) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ea81;
        }
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        iVar7 = andres::
                UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                ::operator()((UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                              *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013eadf:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (iVar7 + ((int *)uVar6)[sVar21 * sVar26 + sVar22] != 0) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013eadf;
        }
        local_168.e2_._0_4_ = 2;
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar8 = andres::
                BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                              *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ebbf:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (vVar8 != ((int *)uVar6)[sVar21 * sVar26 + sVar22] + 2) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ebbf;
        }
        local_168.e2_._0_4_ = 2;
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar9 = andres::
                BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                              *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ec52:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (vVar9 != ((int *)uVar6)[sVar21 * sVar26 + sVar22] + 2) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ec52;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_168,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_148);
        vVar10 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                 ::operator()(&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
LAB_0013ec76:
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ec84:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        iVar7 = ((int *)uVar6)[sVar21 * sVar26 + sVar22];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148);
        uVar6 = local_148._0_8_;
        if (((int *)local_148._0_8_ == (int *)0x0) || (local_120 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013ec76;
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,3,
                            local_178,sVar23);
        if (vVar10 != iVar7 + *(int *)(uVar6 + (sVar21 * sVar26 + sVar22) * 4)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ec84;
        }
        local_168.e2_._0_4_ = 2;
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar11 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ecb6:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (vVar11 != 2 - ((int *)uVar6)[sVar21 * sVar26 + sVar22]) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ecb6;
        }
        local_168.e2_._0_4_ = 2;
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar12 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ec20:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (vVar12 != ((int *)uVar6)[sVar21 * sVar26 + sVar22] + -2) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ec20;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                    *)&local_168,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_148);
        vVar13 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
LAB_0013ee6e:
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ee7c:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        iVar7 = ((int *)uVar6)[sVar21 * sVar26 + sVar22];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148);
        uVar6 = local_148._0_8_;
        if (((int *)local_148._0_8_ == (int *)0x0) || (local_120 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013ee6e;
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,3,
                            local_178,sVar23);
        if (vVar13 != iVar7 - *(int *)(uVar6 + (sVar21 * sVar26 + sVar22) * 4)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ee7c;
        }
        local_168.e2_._0_4_ = 2;
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar14 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ee4a:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (vVar14 != ((int *)uVar6)[sVar21 * sVar26 + sVar22] * 2) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ee4a;
        }
        local_168.e2_._0_4_ = 2;
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar15 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013edc5:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (vVar15 != ((int *)uVar6)[sVar21 * sVar26 + sVar22] * 2) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013edc5;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                    *)&local_168,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_148);
        vVar16 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
LAB_0013ee0a:
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013ee18:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        iVar7 = ((int *)uVar6)[sVar21 * sVar26 + sVar22];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148);
        uVar6 = local_148._0_8_;
        if (((int *)local_148._0_8_ == (int *)0x0) || (local_120 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013ee0a;
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,3,
                            local_178,sVar23);
        if (vVar16 != iVar7 * *(int *)(uVar6 + (sVar21 * sVar26 + sVar22) * 4)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013ee18;
        }
        local_168.e2_._0_4_ = 2;
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar17 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013efd5:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (vVar17 != (int)(2 / (long)((int *)uVar6)[sVar21 * sVar26 + sVar22])) {
          plVar24 = (logic_error *)
                    __cxa_allocate_exception
                              (0x10,sVar26,
                               2 % (long)((int *)uVar6)[sVar21 * sVar26 + sVar22] & 0xffffffff);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013efd5;
        }
        local_168.e2_._0_4_ = 2;
        local_168.e1_ = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        vVar18 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013eeda:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        if (vVar18 != ((int *)uVar6)[sVar21 * sVar26 + sVar22] / 2) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013eeda;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                    *)&local_168,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_148);
        vVar19 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_168,sVar26,local_178,sVar23);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
LAB_0013ef95:
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013efa3:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar22 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,sVar23);
        iVar7 = ((int *)uVar6)[sVar21 * sVar26 + sVar22];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148);
        uVar6 = local_148._0_8_;
        if (((int *)local_148._0_8_ == (int *)0x0) || (local_120 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013ef95;
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,0);
        sVar23 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,3,
                            local_178,sVar23);
        iVar1 = ((int *)(uVar6 + sVar21 * sVar26 * 4))[sVar23];
        if (vVar19 != iVar7 / iVar1) {
          plVar24 = (logic_error *)
                    __cxa_allocate_exception
                              (0x10,(int *)(uVar6 + sVar21 * sVar26 * 4),
                               (long)iVar7 % (long)iVar1 & 0xffffffff);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013efa3;
        }
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_78,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_100);
        local_b0 = 2;
        local_b8 = (View<int,_false,_std::allocator<unsigned_long>_> *)local_100;
        andres::
        BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_48,
                   (ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_b8,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_148);
        andres::
        BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_60,
                   (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_78,
                   (ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_48);
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_90,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_148,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_148);
        andres::
        BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                    *)&local_168,
                   (ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int>
                    *)&local_60,
                   (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_90);
        local_bc = andres::
                   BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                   ::operator()((BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                                 *)&local_168,sVar26,local_178,local_150);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
LAB_0013f0a3:
          pcVar25 = std::runtime_error::~runtime_error;
          puVar27 = &std::runtime_error::typeinfo;
LAB_0013f0b1:
          __cxa_throw(plVar24,puVar27,pcVar25);
        }
        sVar23 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,local_150);
        iVar7 = ((int *)uVar6)[sVar23 * sVar26 + sVar21];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013f0a3;
        }
        sVar23 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,local_150);
        iVar1 = ((int *)uVar6)[sVar23 * sVar26 + sVar21];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
        uVar6 = local_100._0_8_;
        if (((ExpressionTemplateTest *)local_100._0_8_ == (ExpressionTemplateTest *)0x0) ||
           (local_d8 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013f0a3;
        }
        sVar23 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100,3,
                            local_178,local_150);
        iVar2 = ((int *)uVar6)[sVar23 * sVar26 + sVar21];
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148);
        uVar6 = local_148._0_8_;
        if (((int *)local_148._0_8_ == (int *)0x0) || (local_120 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013f0a3;
        }
        sVar23 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,3,
                            local_178,local_150);
        iVar3 = *(int *)(uVar6 + (sVar23 * sVar26 + sVar21) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148);
        uVar6 = local_148._0_8_;
        if (((int *)local_148._0_8_ == (int *)0x0) || (local_120 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013f0a3;
        }
        sVar23 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,0);
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,3,
                            local_178,local_150);
        iVar4 = *(int *)(uVar6 + (sVar23 * sVar26 + sVar21) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148);
        uVar6 = local_148._0_8_;
        if (((int *)local_148._0_8_ == (int *)0x0) || (local_120 != 3)) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar24,"Assertion failed.");
          goto LAB_0013f0a3;
        }
        sVar21 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,0);
        sVar23 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_148,3,
                            local_178,local_150);
        if (local_bc !=
            iVar4 * *(int *)(uVar6 + (sVar21 * sVar26 + sVar23) * 4) +
            iVar7 * iVar1 + iVar2 * iVar3 * -2) {
          plVar24 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar24,"test failed.");
          pcVar25 = std::logic_error::~logic_error;
          puVar27 = &std::logic_error::typeinfo;
          goto LAB_0013f0b1;
        }
        sVar26 = 1;
        uVar5 = local_104 & 1;
        local_104 = 0;
      } while (uVar5 != 0);
      local_178 = local_178 + 1;
    } while (local_178 != 3);
    sVar26 = 1;
    uVar5 = local_108 & 1;
    local_108 = 0;
    if (uVar5 == 0) {
      operator_delete(local_138,local_120 * 0x18);
      operator_delete(local_f0,local_d8 * 0x18);
      return;
    }
  } while( true );
}

Assistant:

void ExpressionTemplateTest::arithmeticOperatorsTest()
{
    std::size_t shape[] = {2, 3, 2};
    andres::View<int> v(shape, shape+3, dataInt_);
    andres::View<int> w(shape, shape+3, dataInt_ + 2);
    for(std::size_t z=0; z<2; ++z) {
        for(std::size_t y=0; y<3; ++y) {
            for(std::size_t x=0; x<2; ++x) {
                test((+v)(x,y,z) == + v(x,y,z));

                test((-v)(x,y,z) == - v(x,y,z));

                test((2+v)(x,y,z) == 2 + v(x,y,z));
                test((v+2)(x,y,z) == v(x,y,z) + 2);
                test((v+w)(x,y,z) == v(x,y,z) + w(x,y,z));

                test((2-v)(x,y,z) == 2 - v(x,y,z));
                test((v-2)(x,y,z) == v(x,y,z) - 2);
                test((v-w)(x,y,z) == v(x,y,z) - w(x,y,z));

                test((2*v)(x,y,z) == 2 * v(x,y,z));
                test((v*2)(x,y,z) == v(x,y,z) * 2);
                test((v*w)(x,y,z) == v(x,y,z) * w(x,y,z));

                test((2/v)(x,y,z) == 2 / v(x,y,z));
                test((v/2)(x,y,z) == v(x,y,z) / 2);
                test((v/w)(x,y,z) == v(x,y,z) / w(x,y,z));

                test((v*v - 2*v*w + w*w)(x,y,z)
                    == v(x,y,z)*v(x,y,z) - 2*v(x,y,z)*w(x,y,z)
                       + w(x,y,z)*w(x,y,z));
            }
        }
    }
}